

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O2

void __thiscall CaDiCaL::LratChecker::report_status(LratChecker *this,int param_1,uint64_t param_2)

{
  Internal *pIVar1;
  undefined4 in_register_00000034;
  FILE *profile;
  double s;
  double s_00;
  
  pIVar1 = this->internal;
  profile = (FILE *)CONCAT44(in_register_00000034,param_1);
  if ((pIVar1->profiles).checking.level <= (pIVar1->opts).profile) {
    profile = (FILE *)&(pIVar1->profiles).checking;
    Internal::time(pIVar1,(time_t *)CONCAT44(in_register_00000034,param_1));
    Internal::start_profiling(pIVar1,(Profile *)profile,s);
  }
  if (this->num_finalized == this->num_clauses) {
    this->num_finalized = 0;
  }
  else {
    fatal_message_start();
    fputs("finalize check failed ",_stderr);
    fprintf(_stderr,"%lu",this->num_clauses);
    profile = _stderr;
    fputs(" are not finalized",_stderr);
    fatal_message_end();
  }
  pIVar1 = this->internal;
  if ((pIVar1->opts).profile < (pIVar1->profiles).checking.level) {
    return;
  }
  Internal::time(pIVar1,(time_t *)profile);
  Internal::stop_profiling(pIVar1,&(pIVar1->profiles).checking,s_00);
  return;
}

Assistant:

void LratChecker::report_status (int, uint64_t) {
  START (checking);
  if (num_finalized == num_clauses) {
    num_finalized = 0;
    LOG ("LRAT CHECKER successful finalize check, all clauses have been "
         "deleted");
  } else {
    fatal_message_start ();
    fputs ("finalize check failed ", stderr);
    fprintf (stderr, "%" PRIu64, num_clauses);
    fputs (" are not finalized", stderr);
    fatal_message_end ();
  }
  STOP (checking);
}